

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddMouseButtonEvent(ImGuiIO *this,int mouse_button,bool down)

{
  ImGuiContext *pIVar1;
  ImGuiInputEvent *pIVar2;
  bool *pbVar3;
  ImGuiInputEvent e;
  
  pIVar1 = GImGui;
  if (this->AppAcceptingEvents == true) {
    pIVar2 = FindLatestInputEvent(ImGuiInputEventType_MouseButton,mouse_button);
    pbVar3 = (pIVar1->IO).MouseDown + mouse_button;
    if (pIVar2 != (ImGuiInputEvent *)0x0) {
      pbVar3 = &(pIVar2->field_2).MouseButton.Down;
    }
    if (*pbVar3 != down) {
      e.AddedByTestEngine = false;
      e._21_3_ = 0;
      e.Type = ImGuiInputEventType_MouseButton;
      e.Source = ImGuiInputSource_Mouse;
      e.field_2._5_7_ = 0;
      e.field_2.MouseButton.Down = down;
      e.field_2.MouseButton.Button = mouse_button;
      ImVector<ImGuiInputEvent>::push_back(&pIVar1->InputEventsQueue,&e);
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddMouseButtonEvent(int mouse_button, bool down)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
    if (!AppAcceptingEvents)
        return;

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_MouseButton, (int)mouse_button);
    const bool latest_button_down = latest_event ? latest_event->MouseButton.Down : g.IO.MouseDown[mouse_button];
    if (latest_button_down == down)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseButton;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseButton.Button = mouse_button;
    e.MouseButton.Down = down;
    g.InputEventsQueue.push_back(e);
}